

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O3

vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
* __thiscall
spvtools::opt::analysis::ConstantManager::GetConstantsFromIds
          (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
           *__return_storage_ptr__,ConstantManager *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *ids)

{
  pointer puVar1;
  const_iterator cVar2;
  pointer puVar3;
  uint local_5c;
  undefined8 local_58;
  iterator iStack_50;
  pointer local_48;
  Constant *local_38;
  
  local_58._0_4_ = 0;
  local_58._4_4_ = 0;
  iStack_50._M_current._0_4_ = 0;
  iStack_50._M_current._4_4_ = 0;
  local_58 = (void *)0x0;
  iStack_50._M_current = (Constant **)0x0;
  local_48 = (pointer)0x0;
  puVar3 = (ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar3 == puVar1) {
    local_48 = (pointer)0x0;
  }
  else {
    do {
      local_5c = *puVar3;
      cVar2 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->id_to_const_val_)._M_h,&local_5c);
      if ((cVar2.
           super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false>
           ._M_cur == (__node_type *)0x0) ||
         (local_38 = *(Constant **)
                      ((long)cVar2.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false>
                             ._M_cur + 0x10), local_38 == (Constant *)0x0)) {
        (__return_storage_ptr__->
        super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (local_58 == (void *)0x0) {
          return __return_storage_ptr__;
        }
        operator_delete(local_58,(long)local_48 - (long)local_58);
        return __return_storage_ptr__;
      }
      if (iStack_50._M_current == local_48) {
        std::
        vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>
        ::_M_realloc_insert<spvtools::opt::analysis::Constant_const*const&>
                  ((vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>
                    *)&local_58,iStack_50,&local_38);
      }
      else {
        *iStack_50._M_current = local_38;
        iStack_50._M_current = iStack_50._M_current + 1;
      }
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar1);
  }
  *(undefined4 *)
   &(__return_storage_ptr__->
    super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
    )._M_impl.super__Vector_impl_data._M_start = (undefined4)local_58;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
           )._M_impl.super__Vector_impl_data._M_start + 4) = local_58._4_4_;
  *(undefined4 *)
   &(__return_storage_ptr__->
    super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
    )._M_impl.super__Vector_impl_data._M_finish = iStack_50._M_current._0_4_;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
           )._M_impl.super__Vector_impl_data._M_finish + 4) = iStack_50._M_current._4_4_;
  (__return_storage_ptr__->
  super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = local_48;
  return __return_storage_ptr__;
}

Assistant:

std::vector<const Constant*> ConstantManager::GetConstantsFromIds(
    const std::vector<uint32_t>& ids) const {
  std::vector<const Constant*> constants;
  for (uint32_t id : ids) {
    if (const Constant* c = FindDeclaredConstant(id)) {
      constants.push_back(c);
    } else {
      return {};
    }
  }
  return constants;
}